

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O1

int32_t __thiscall
icu_63::number::impl::NumberStringBuilder::insert
          (NumberStringBuilder *this,int32_t index,UnicodeString *unistr,int32_t start,int32_t end,
          Field field,UErrorCode *status)

{
  bool bVar1;
  short sVar2;
  int32_t iVar3;
  long lVar4;
  uint count;
  long lVar5;
  ulong uVar6;
  ValueOrHeapArray<char16_t> *pVVar7;
  ValueOrHeapArray<UNumberFormatFields> *pVVar8;
  char16_t cVar9;
  char16_t *pcVar10;
  uint uVar11;
  bool bVar12;
  
  count = end - start;
  iVar3 = prepareForInsert(this,index,count,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR && (count != 0 && start <= end)) {
    bVar1 = this->fUsingHeap;
    lVar5 = (long)start;
    lVar4 = (long)iVar3;
    uVar6 = (ulong)count;
    do {
      sVar2 = (unistr->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        uVar11 = (unistr->fUnion).fFields.fLength;
      }
      else {
        uVar11 = (int)sVar2 >> 5;
      }
      cVar9 = L'\xffff';
      if ((uint)lVar5 < uVar11) {
        pcVar10 = (char16_t *)((long)&unistr->fUnion + 2);
        if (((int)sVar2 & 2U) == 0) {
          pcVar10 = (unistr->fUnion).fFields.fArray;
        }
        cVar9 = pcVar10[lVar5];
      }
      bVar12 = bVar1 == false;
      pVVar7 = (ValueOrHeapArray<char16_t> *)(this->fChars).heap.ptr;
      if (bVar12) {
        pVVar7 = &this->fChars;
      }
      pVVar7->value[lVar4] = cVar9;
      pVVar8 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
      if (bVar12) {
        pVVar8 = &this->fFields;
      }
      pVVar8->value[lVar4] = field;
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 1;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return count;
}

Assistant:

int32_t
NumberStringBuilder::insert(int32_t index, const UnicodeString &unistr, int32_t start, int32_t end,
                            Field field, UErrorCode &status) {
    int32_t count = end - start;
    int32_t position = prepareForInsert(index, count, status);
    if (U_FAILURE(status)) {
        return count;
    }
    for (int32_t i = 0; i < count; i++) {
        getCharPtr()[position + i] = unistr.charAt(start + i);
        getFieldPtr()[position + i] = field;
    }
    return count;
}